

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAxisSweep3.h
# Opt level: O2

void __thiscall
btAxisSweep3Internal<unsigned_short>::rayTest
          (btAxisSweep3Internal<unsigned_short> *this,btVector3 *rayFrom,btVector3 *rayTo,
          btBroadphaseRayCallback *rayCallback,btVector3 *aabbMin,btVector3 *aabbMax)

{
  unsigned_short i;
  ushort uVar1;
  
  if (this->m_raycastAccelerator != (btDbvtBroadphase *)0x0) {
    (*(this->m_raycastAccelerator->super_btBroadphaseInterface)._vptr_btBroadphaseInterface[6])();
    return;
  }
  for (uVar1 = 1; (uint)uVar1 <= (uint)this->m_numHandles * 2; uVar1 = uVar1 + 1) {
    if ((this->m_pEdges[0][uVar1].m_pos & 1) != 0) {
      (*(rayCallback->super_btBroadphaseAabbCallback)._vptr_btBroadphaseAabbCallback[2])
                (rayCallback,this->m_pHandles + this->m_pEdges[0][uVar1].m_handle);
    }
  }
  return;
}

Assistant:

void	btAxisSweep3Internal<BP_FP_INT_TYPE>::rayTest(const btVector3& rayFrom,const btVector3& rayTo, btBroadphaseRayCallback& rayCallback,const btVector3& aabbMin,const btVector3& aabbMax)
{
	if (m_raycastAccelerator)
	{
		m_raycastAccelerator->rayTest(rayFrom,rayTo,rayCallback,aabbMin,aabbMax);
	} else
	{
		//choose axis?
		BP_FP_INT_TYPE axis = 0;
		//for each proxy
		for (BP_FP_INT_TYPE i=1;i<m_numHandles*2+1;i++)
		{
			if (m_pEdges[axis][i].IsMax())
			{
				rayCallback.process(getHandle(m_pEdges[axis][i].m_handle));
			}
		}
	}
}